

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_server.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *__dest;
  char *pcVar1;
  undefined4 uVar2;
  sz_pid_t v;
  LogStream *this;
  char **ppcVar3;
  int *in_FS_OFFSET;
  SourceFile file;
  undefined1 local_10e8 [8];
  Channel channel;
  char *local_138 [4];
  undefined1 local_118 [8];
  EventLoop loop;
  undefined1 local_3c [8];
  InetAddress bindAddr;
  Socket sock;
  
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x13;
    file.m_data = "udp_echo_server.cpp";
    sznet::Logger::Logger((Logger *)local_10e8,file,0x4a);
    if (6 < (uint)((int)local_138 - (int)local_138[0])) {
      builtin_strncpy(local_138[0],"pid = ",6);
      local_138[0] = local_138[0] + 6;
    }
    v = sznet::sz_getpid();
    this = sznet::LogStream::operator<<((LogStream *)&channel,v);
    pcVar1 = (this->m_buffer).m_cur;
    ppcVar3 = &(this->m_buffer).m_cur;
    if (8 < (uint)((int)ppcVar3 - (int)pcVar1)) {
      builtin_strncpy(pcVar1,", tid = ",8);
      *ppcVar3 = *ppcVar3 + 8;
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    if (*in_FS_OFFSET == 0) {
      sznet::CurrentThread::cacheTid();
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    sznet::LogStream::operator<<(this,*in_FS_OFFSET);
    sznet::Logger::~Logger((Logger *)local_10e8);
  }
  sznet::net::EventLoop::EventLoop((EventLoop *)local_118);
  g_pLoopsRun = (EventLoop *)local_118;
  sznet::net::InetAddress::InetAddress((InetAddress *)local_3c,0x7e7,false,false);
  bindAddr.field_0._20_4_ = sznet::net::sockets::sz_udp_create((uint)(ushort)local_3c._0_2_);
  bindAddr.field_0.m_addr6.sin6_scope_id._0_1_ = 1;
  sznet::net::sockets::sz_sock_setnonblock(bindAddr.field_0._20_4_,true);
  sznet::net::Socket::bindAddress
            ((Socket *)((long)&bindAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc),
             (InetAddress *)local_3c);
  sznet::net::Channel::Channel((Channel *)local_10e8,(EventLoop *)local_118,bindAddr.field_0._20_4_)
  ;
  uVar2 = bindAddr.field_0._20_4_;
  loop.m_pendingFunctors.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loop.m_pendingFunctors.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)operator_new(0x10);
  *(code **)&((loop.m_pendingFunctors.
               super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage)->super__Function_base)._M_functor
       = UdpServerReadCallback;
  *(undefined4 *)
   ((long)&((loop.m_pendingFunctors.
             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->super__Function_base)._M_functor +
   8) = uVar2;
  std::function<void_(sznet::Timestamp)>::operator=
            ((function<void_(sznet::Timestamp)> *)&channel.m_tied,
             (function<void_(sznet::Timestamp)> *)
             &loop.m_pendingFunctors.
              super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  __dest = &loop.m_pendingFunctors.
            super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  _Function_handler<void_(sznet::Timestamp),_std::_Bind<void_(*(int,_std::_Placeholder<1>))(int,_sznet::Timestamp)>_>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  channel.m_loop._4_1_ = channel.m_loop._4_1_ | 1;
  sznet::net::Channel::update((Channel *)local_10e8);
  sznet::net::EventLoop::loop((EventLoop *)local_118);
  sznet::net::Channel::~Channel((Channel *)local_10e8);
  sznet::net::Socket::~Socket((Socket *)((long)&bindAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc));
  sznet::net::EventLoop::~EventLoop((EventLoop *)local_118);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();

    EventLoop loop;
    g_pLoopsRun = &loop;
    InetAddress bindAddr(2023);
    Socket sock(sockets::sz_udp_create(bindAddr.family()));
    sockets::sz_sock_setnonblock(sock.fd(), true);
    sock.bindAddress(bindAddr);
    Channel channel(&loop, sock.fd());
    channel.setReadCallback(std::bind(&UdpServerReadCallback, sock.fd(), std::placeholders::_1));
    channel.enableReading();

    loop.loop();

    return 0;
}